

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

String * __thiscall
capnp::anon_unknown_79::Parser::consumeQuotedString(String *__return_storage_ptr__,Parser *this)

{
  Input *this_00;
  Input *pIVar1;
  char *__src;
  RemoveConst<char> *pRVar2;
  unsigned_long uVar3;
  undefined8 uVar4;
  char cVar5;
  byte bVar6;
  String *pSVar7;
  undefined1 *puVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  Input *pIVar12;
  size_t sVar13;
  undefined1 *puVar14;
  size_t sVar15;
  char *pcVar16;
  size_t needed;
  ulong __n;
  ArrayPtr<const_char16_t> utf16;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Vector<char> local_98;
  Fault local_70;
  DebugComparison<unsigned_long,_int> local_68;
  String *local_38;
  
  this_00 = &this->input;
  local_38 = __return_storage_ptr__;
  Input::consume(this_00,'\"');
  pIVar1 = (Input *)(this->input).wrapped.ptr;
  pIVar12 = pIVar1;
  if ((this->input).wrapped.size_ != 0) {
    do {
      if (((*(char *)&(pIVar12->wrapped).ptr == '\0') ||
          (cVar5 = Input::nextChar(pIVar12), cVar5 == '\"')) || (cVar5 == '\\')) break;
      Input::advance(this_00,1);
      pIVar12 = (Input *)(this->input).wrapped.ptr;
    } while ((this->input).wrapped.size_ != 0);
    pIVar12 = (Input *)(this->input).wrapped.ptr;
  }
  __n = (long)pIVar12 - (long)pIVar1;
  cVar5 = Input::nextChar(pIVar12);
  if (cVar5 == '\"') {
    Input::advance(this_00,1);
    pSVar7 = kj::heapString(local_38,(char *)pIVar1,__n);
    return pSVar7;
  }
  local_98.builder.ptr = (char *)0x0;
  local_98.builder.pos = (RemoveConst<char> *)0x0;
  local_98.builder.endPtr = (char *)0x0;
  local_98.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  if (pIVar12 != pIVar1) {
    sVar15 = 4;
    if (4 < __n) {
      sVar15 = __n;
    }
    kj::Vector<char>::setCapacity(&local_98,sVar15);
  }
  pRVar2 = local_98.builder.pos;
  if (pIVar12 != pIVar1) {
    memcpy(local_98.builder.pos,pIVar1,__n);
    local_98.builder.pos = (RemoveConst<char> *)((long)pRVar2 + __n);
  }
  do {
    pIVar1 = (Input *)(this->input).wrapped.ptr;
    pIVar12 = pIVar1;
    if ((this->input).wrapped.size_ != 0) {
      do {
        if (((*(char *)&(pIVar12->wrapped).ptr == '\0') ||
            (cVar5 = Input::nextChar(pIVar12), cVar5 == '\"')) || (cVar5 == '\\')) break;
        Input::advance(this_00,1);
        pIVar12 = (Input *)(this->input).wrapped.ptr;
      } while ((this->input).wrapped.size_ != 0);
      pIVar12 = (Input *)(this_00->wrapped).ptr;
    }
    sVar13 = (long)pIVar12 - (long)pIVar1;
    puVar8 = (undefined1 *)((long)local_98.builder.pos + (sVar13 - (long)local_98.builder.ptr));
    if ((undefined1 *)((long)local_98.builder.endPtr - (long)local_98.builder.ptr) < puVar8) {
      puVar14 = (undefined1 *)(((long)local_98.builder.endPtr - (long)local_98.builder.ptr) * 2);
      if (local_98.builder.endPtr == local_98.builder.ptr) {
        puVar14 = (undefined1 *)0x4;
      }
      if (puVar14 < puVar8) {
        puVar14 = puVar8;
      }
      kj::Vector<char>::setCapacity(&local_98,(size_t)puVar14);
    }
    pRVar2 = local_98.builder.pos;
    if (pIVar12 != pIVar1) {
      memcpy(local_98.builder.pos,pIVar1,sVar13);
      local_98.builder.pos = (RemoveConst<char> *)((long)pRVar2 + sVar13);
    }
    cVar5 = Input::nextChar((Input *)(this->input).wrapped.ptr);
    if (cVar5 == '\\') {
      Input::advance(this_00,1);
      bVar6 = Input::nextChar((Input *)(this->input).wrapped.ptr);
      if (bVar6 < 0x62) {
        if (bVar6 == 0x22) {
          if (local_98.builder.pos == local_98.builder.endPtr) {
            sVar15 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
            if (local_98.builder.pos == local_98.builder.ptr) {
              sVar15 = 4;
            }
            kj::Vector<char>::setCapacity(&local_98,sVar15);
          }
          *(undefined1 *)&((Array<char> *)local_98.builder.pos)->ptr = 0x22;
        }
        else if (bVar6 == 0x2f) {
          if (local_98.builder.pos == local_98.builder.endPtr) {
            sVar15 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
            if (local_98.builder.pos == local_98.builder.ptr) {
              sVar15 = 4;
            }
            kj::Vector<char>::setCapacity(&local_98,sVar15);
          }
          *(undefined1 *)&((Array<char> *)local_98.builder.pos)->ptr = 0x2f;
        }
        else {
          if (bVar6 != 0x5c) goto switchD_002e5bb6_caseD_6f;
          if (local_98.builder.pos == local_98.builder.endPtr) {
            sVar15 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
            if (local_98.builder.pos == local_98.builder.ptr) {
              sVar15 = 4;
            }
            kj::Vector<char>::setCapacity(&local_98,sVar15);
          }
          *(undefined1 *)&((Array<char> *)local_98.builder.pos)->ptr = 0x5c;
        }
      }
      else {
        switch(bVar6) {
        case 0x6e:
          if (local_98.builder.pos == local_98.builder.endPtr) {
            sVar15 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
            if (local_98.builder.pos == local_98.builder.ptr) {
              sVar15 = 4;
            }
            kj::Vector<char>::setCapacity(&local_98,sVar15);
          }
          *(undefined1 *)&((Array<char> *)local_98.builder.pos)->ptr = 10;
          break;
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x73:
switchD_002e5bb6_caseD_6f:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                    ((Fault *)&local_68,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                     ,0x31e,FAILED,(char *)0x0,"\"Invalid escape in JSON string.\"",
                     (char (*) [31])"Invalid escape in JSON string.");
          kj::_::Debug::Fault::fatal((Fault *)&local_68);
        case 0x72:
          if (local_98.builder.pos == local_98.builder.endPtr) {
            sVar15 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
            if (local_98.builder.pos == local_98.builder.ptr) {
              sVar15 = 4;
            }
            kj::Vector<char>::setCapacity(&local_98,sVar15);
          }
          *(undefined1 *)&((Array<char> *)local_98.builder.pos)->ptr = 0xd;
          break;
        case 0x74:
          if (local_98.builder.pos == local_98.builder.endPtr) {
            sVar15 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
            if (local_98.builder.pos == local_98.builder.ptr) {
              sVar15 = 4;
            }
            kj::Vector<char>::setCapacity(&local_98,sVar15);
          }
          *(undefined1 *)&((Array<char> *)local_98.builder.pos)->ptr = 9;
          break;
        case 0x75:
          Input::consume(this_00,'u');
          pcVar16 = (this_00->wrapped).ptr;
          Input::advance(this_00,4);
          local_68.left = (unsigned_long)((this_00->wrapped).ptr + -(long)pcVar16);
          local_68.right = 4;
          local_68.op.content.ptr = " == ";
          local_68.op.content.size_ = 5;
          local_68.result = (undefined1 *)local_68.left == &DAT_00000004;
          if (!local_68.result) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
                      (&local_70,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                       ,0x345,FAILED,"hex.size() == 4","_kjCondition,",&local_68);
            kj::_::Debug::Fault::fatal(&local_70);
          }
          lVar9 = 0;
          uVar11 = 0;
          do {
            cVar5 = pcVar16[lVar9];
            utf16.size_._0_4_ = (int)cVar5;
            local_70.exception._0_2_ = CONCAT11(local_70.exception._1_1_,cVar5);
            iVar10 = -0x30;
            if (((9 < (byte)(cVar5 - 0x30U)) && (iVar10 = -0x57, 5 < (byte)(cVar5 + 0x9fU))) &&
               (iVar10 = -0x37, 5 < (byte)(cVar5 + 0xbfU))) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37],char&>
                        ((Fault *)&local_68,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                         ,0x353,FAILED,(char *)0x0,"\"Invalid hex digit in unicode escape.\", c",
                         (char (*) [37])"Invalid hex digit in unicode escape.",(char *)&local_70);
              kj::_::Debug::Fault::fatal((Fault *)&local_68);
            }
            uVar11 = iVar10 + (int)utf16.size_ | uVar11 << 4;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          if ((int)uVar11 < 0x80) {
            if (local_98.builder.pos == local_98.builder.endPtr) {
              sVar15 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
              if (local_98.builder.pos == local_98.builder.ptr) {
                sVar15 = 4;
              }
              kj::Vector<char>::setCapacity(&local_98,sVar15);
            }
            *(byte *)&((Array<char> *)local_98.builder.pos)->ptr = (byte)uVar11 & 0x7f;
            local_98.builder.pos =
                 (RemoveConst<char> *)((long)&((Array<char> *)local_98.builder.pos)->ptr + 1);
          }
          else {
            local_70.exception._0_2_ = (undefined2)uVar11;
            utf16.ptr = (char16_t *)0x1;
            utf16.size_._4_4_ = 0;
            kj::decodeUtf16((EncodingResult<kj::String> *)&local_68,(kj *)&local_70,utf16);
            pcVar16 = (char *)(local_68.left + local_68._8_8_ + -1);
            __src = (char *)local_68.left;
            if (local_68._8_8_ == 0) {
              pcVar16 = (char *)0x0;
              __src = (char *)0x0;
            }
            sVar13 = (long)pcVar16 - (long)__src;
            puVar8 = (undefined1 *)
                     ((long)local_98.builder.pos + (sVar13 - (long)local_98.builder.ptr));
            if ((undefined1 *)((long)local_98.builder.endPtr - (long)local_98.builder.ptr) < puVar8)
            {
              puVar14 = (undefined1 *)
                        (((long)local_98.builder.endPtr - (long)local_98.builder.ptr) * 2);
              if (local_98.builder.endPtr == local_98.builder.ptr) {
                puVar14 = (undefined1 *)0x4;
              }
              if (puVar14 < puVar8) {
                puVar14 = puVar8;
              }
              kj::Vector<char>::setCapacity(&local_98,(size_t)puVar14);
            }
            pRVar2 = local_98.builder.pos;
            if (__src != pcVar16) {
              memcpy(local_98.builder.pos,__src,sVar13);
              local_98.builder.pos = (RemoveConst<char> *)((long)pRVar2 + sVar13);
            }
            uVar4 = local_68._8_8_;
            uVar3 = local_68.left;
            if ((char *)local_68.left != (char *)0x0) {
              local_68.left = 0;
              local_68._8_8_ = 0;
              (*(code *)**(undefined8 **)local_68.op.content.ptr)
                        (local_68.op.content.ptr,uVar3,1,uVar4,uVar4,0);
            }
          }
          goto LAB_002e5e70;
        default:
          if (bVar6 == 0x62) {
            if (local_98.builder.pos == local_98.builder.endPtr) {
              sVar15 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
              if (local_98.builder.pos == local_98.builder.ptr) {
                sVar15 = 4;
              }
              kj::Vector<char>::setCapacity(&local_98,sVar15);
            }
            *(undefined1 *)&((Array<char> *)local_98.builder.pos)->ptr = 8;
          }
          else {
            if (bVar6 != 0x66) goto switchD_002e5bb6_caseD_6f;
            if (local_98.builder.pos == local_98.builder.endPtr) {
              sVar15 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
              if (local_98.builder.pos == local_98.builder.ptr) {
                sVar15 = 4;
              }
              kj::Vector<char>::setCapacity(&local_98,sVar15);
            }
            *(undefined1 *)&((Array<char> *)local_98.builder.pos)->ptr = 0xc;
          }
        }
      }
      local_98.builder.pos =
           (RemoveConst<char> *)((long)&((Array<char> *)local_98.builder.pos)->ptr + 1);
      Input::advance(this_00,1);
    }
LAB_002e5e70:
    cVar5 = Input::nextChar((Input *)(this->input).wrapped.ptr);
    if (cVar5 == '\"') {
      Input::consume(this_00,'\"');
      if (local_98.builder.pos == local_98.builder.endPtr) {
        sVar15 = 4;
        if (local_98.builder.pos != local_98.builder.ptr) {
          sVar15 = ((long)local_98.builder.pos - (long)local_98.builder.ptr) * 2;
        }
        kj::Vector<char>::setCapacity(&local_98,sVar15);
      }
      *(undefined1 *)&((Array<char> *)local_98.builder.pos)->ptr = 0;
      local_98.builder.pos =
           (RemoveConst<char> *)((long)&((Array<char> *)local_98.builder.pos)->ptr + 1);
      if (local_98.builder.pos != local_98.builder.endPtr) {
        kj::Vector<char>::setCapacity
                  (&local_98,(long)local_98.builder.pos - (long)local_98.builder.ptr);
      }
      (local_38->content).ptr = local_98.builder.ptr;
      (local_38->content).size_ = (long)local_98.builder.pos - (long)local_98.builder.ptr;
      (local_38->content).disposer = local_98.builder.disposer;
      return (String *)local_98.builder.ptr;
    }
  } while( true );
}

Assistant:

kj::String consumeQuotedString() {
    input.consume('"');
    // TODO(perf): Get statistics on string size and preallocate?

    auto initalString = input.consumeWhile([](const char chr) {
        return chr != '"' && chr != '\\';
    });
    if (input.nextChar() == '"') {
      // optimization: Avoid allocating vector if no escapes encountered.
      input.advance();
      return kj::heapString(initalString.begin(), initalString.size());
    }

    kj::Vector<char> decoded;
    decoded.addAll(initalString);

    do {
      auto stringValue = input.consumeWhile([](const char chr) {
          return chr != '"' && chr != '\\';
      });

      decoded.addAll(stringValue);

      if (input.nextChar() == '\\') {  // handle escapes.
        input.advance();
        switch(input.nextChar()) {
          case '"' : decoded.add('"' ); input.advance(); break;
          case '\\': decoded.add('\\'); input.advance(); break;
          case '/' : decoded.add('/' ); input.advance(); break;
          case 'b' : decoded.add('\b'); input.advance(); break;
          case 'f' : decoded.add('\f'); input.advance(); break;
          case 'n' : decoded.add('\n'); input.advance(); break;
          case 'r' : decoded.add('\r'); input.advance(); break;
          case 't' : decoded.add('\t'); input.advance(); break;
          case 'u' :
            input.consume('u');
            unescapeAndAppend(input.consume(size_t(4)), decoded);
            break;
          default: KJ_FAIL_REQUIRE("Invalid escape in JSON string."); break;
        }
      }

    } while(input.nextChar() != '"');

    input.consume('"');
    decoded.add('\0');

    // TODO(perf): This copy can be eliminated, but I can't find the kj::wayToDoIt();
    return kj::String(decoded.releaseAsArray());
  }